

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O2

int * Gia_ManTerCreateMap(Gia_ManTer_t *p,int fVerbose)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Gia_Man_t *pGVar4;
  Gia_Obj_t *pGVar5;
  int iVar6;
  Vec_Ptr_t *pVVar7;
  int *__s;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar8;
  int Entry;
  size_t __size;
  long lVar9;
  int *piVar10;
  uint uVar11;
  uint local_50;
  
  uVar1 = p->vStates->nSize;
  pVVar7 = Gia_ManTerTranspose(p);
  p->vFlops = pVVar7;
  __size = (long)p->pAig->vCis->nSize << 2;
  __s = (int *)malloc(__size);
  piVar10 = __s;
  memset(__s,0xff,__size);
  lVar9 = 0;
  p_00 = Vec_IntAlloc((int)piVar10);
  uVar11 = 0;
  local_50 = 0;
  do {
    iVar6 = p->pAig->nRegs;
    if (iVar6 <= lVar9) {
      Vec_IntFree(p_00);
      if (fVerbose != 0) {
        printf("Transforming %d const and %d equiv registers.\n",(ulong)uVar11,(ulong)local_50);
      }
      return __s;
    }
    Entry = (int)lVar9;
    if (p->pCount0[lVar9] == p->vStates->nSize) {
      __s[(p->pAig->vCis->nSize - iVar6) + Entry] = 0;
      uVar11 = uVar11 + 1;
    }
    else if (p->pCountX[lVar9] == 0) {
      iVar6 = Gia_ManFindEqualFlop
                        (p->vFlops,p_00->nSize,(((int)uVar1 >> 4) + 1) - (uint)((uVar1 & 0xf) == 0))
      ;
      Vec_IntPush(p_00,Entry);
      if (-1 < iVar6) {
        pGVar4 = p->pAig;
        iVar2 = pGVar4->vCis->nSize;
        iVar3 = pGVar4->nRegs;
        iVar6 = Vec_IntEntry(p_00,iVar6);
        iVar6 = Vec_IntEntry(pGVar4->vCis,(iVar2 - iVar3) + iVar6);
        pGVar8 = Gia_ManObj(pGVar4,iVar6);
        pGVar4 = p->pAig;
        pGVar5 = pGVar4->pObjs;
        if ((pGVar8 < pGVar5) || (pGVar5 + pGVar4->nObjs <= pGVar8)) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        iVar6 = (int)(((long)pGVar8 - (long)pGVar5) / 0xc);
        if (iVar6 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        __s[(pGVar4->vCis->nSize - pGVar4->nRegs) + Entry] = iVar6 * 2;
        local_50 = local_50 + 1;
      }
    }
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

int * Gia_ManTerCreateMap( Gia_ManTer_t * p, int fVerbose )
{
    int * pCi2Lit;
    Gia_Obj_t * pObj;
    Vec_Int_t * vMapKtoI;
    int i, iRepr, nFlopWords, Counter0 = 0, CounterE = 0;
    nFlopWords = Abc_BitWordNum( 2*Vec_PtrSize(p->vStates) );
    p->vFlops = Gia_ManTerTranspose( p );
    pCi2Lit = ABC_FALLOC( int, Gia_ManCiNum(p->pAig) );
    vMapKtoI = Vec_IntAlloc( 100 );
    for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
        if ( p->pCount0[i] == Vec_PtrSize(p->vStates) )
            pCi2Lit[Gia_ManPiNum(p->pAig)+i] = 0, Counter0++;
        else if ( p->pCountX[i] == 0 )
        {
            iRepr = Gia_ManFindEqualFlop( p->vFlops, Vec_IntSize(vMapKtoI), nFlopWords );
            Vec_IntPush( vMapKtoI, i );
            if ( iRepr < 0 )
                continue;
            pObj = Gia_ManCi( p->pAig, Gia_ManPiNum(p->pAig)+Vec_IntEntry(vMapKtoI, iRepr) );
            pCi2Lit[Gia_ManPiNum(p->pAig)+i] = Abc_Var2Lit( Gia_ObjId( p->pAig, pObj ), 0 );
            CounterE++;
        }
    Vec_IntFree( vMapKtoI );
    if ( fVerbose )
        printf( "Transforming %d const and %d equiv registers.\n", Counter0, CounterE );
    return pCi2Lit;
}